

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O1

redisAsyncContext * redisAsyncConnectWithOptions(redisOptions *options)

{
  int *piVar1;
  ulong uVar2;
  redisContext *c_00;
  redisAsyncContext *prVar3;
  dict *pdVar4;
  redisContext *c;
  redisOptions myOptions;
  redisOptions local_48;
  
  uVar2._0_4_ = options->type;
  uVar2._4_4_ = options->options;
  local_48.timeout = options->timeout;
  local_48.endpoint.tcp.source_addr = (options->endpoint).tcp.source_addr;
  local_48.endpoint.tcp.ip = (options->endpoint).tcp.ip;
  local_48.endpoint._16_8_ = *(undefined8 *)((long)&options->endpoint + 0x10);
  local_48._0_8_ = uVar2 | 0x100000000;
  c_00 = redisConnectWithOptions(&local_48);
  if (c_00 != (redisContext *)0x0) {
    prVar3 = (redisAsyncContext *)realloc(c_00,0x1b8);
    if (prVar3 == (redisAsyncContext *)0x0) {
      prVar3 = (redisAsyncContext *)0x0;
    }
    else {
      piVar1 = &(prVar3->c).flags;
      *(byte *)piVar1 = (byte)*piVar1 & 0xfd;
      prVar3->err = 0;
      pdVar4 = (dict *)malloc(0x30);
      prVar3->errstr = (char *)0x0;
      prVar3->data = (void *)0x0;
      (prVar3->ev).data = (void *)0x0;
      (prVar3->ev).addRead = (_func_void_void_ptr *)0x0;
      (prVar3->ev).delRead = (_func_void_void_ptr *)0x0;
      (prVar3->ev).addWrite = (_func_void_void_ptr *)0x0;
      (prVar3->ev).delWrite = (_func_void_void_ptr *)0x0;
      (prVar3->ev).cleanup = (_func_void_void_ptr *)0x0;
      (prVar3->ev).scheduleTimer = (_func_void_void_ptr_timeval *)0x0;
      prVar3->onDisconnect = (undefined1 *)0x0;
      prVar3->onConnect = (undefined1 *)0x0;
      (prVar3->replies).head = (redisCallback *)0x0;
      (prVar3->replies).tail = (redisCallback *)0x0;
      (prVar3->sub).invalid.head = (redisCallback *)0x0;
      (prVar3->sub).invalid.tail = (redisCallback *)0x0;
      pdVar4->table = (dictEntry **)0x0;
      pdVar4->used = 0;
      pdVar4->privdata = (void *)0x0;
      pdVar4->size = 0;
      pdVar4->sizemask = 0;
      pdVar4->type = &callbackDict;
      (prVar3->sub).channels = pdVar4;
      pdVar4 = (dict *)malloc(0x30);
      pdVar4->table = (dictEntry **)0x0;
      pdVar4->size = 0;
      pdVar4->sizemask = 0;
      pdVar4->used = 0;
      pdVar4->privdata = (void *)0x0;
      pdVar4->type = &callbackDict;
      (prVar3->sub).patterns = pdVar4;
      pthread_mutex_init((pthread_mutex_t *)&prVar3->ctxlock,(pthread_mutexattr_t *)0x0);
    }
    if (prVar3 != (redisAsyncContext *)0x0) {
      prVar3->err = (prVar3->c).err;
      prVar3->errstr = (prVar3->c).errstr;
      return prVar3;
    }
    redisFree(c_00);
  }
  return (redisAsyncContext *)0x0;
}

Assistant:

redisAsyncContext *redisAsyncConnectWithOptions(const redisOptions *options) {
    redisOptions myOptions = *options;
    redisContext *c;
    redisAsyncContext *ac;

    myOptions.options |= REDIS_OPT_NONBLOCK;
    c = redisConnectWithOptions(&myOptions);
    if (c == NULL) {
        return NULL;
    }
    ac = redisAsyncInitialize(c);
    if (ac == NULL) {
        redisFree(c);
        return NULL;
    }
    __redisAsyncCopyError(ac);
    return ac;
}